

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueTask(cl_command_queue command_queue,cl_kernel kernel,cl_uint num_events_in_wait_list
                    ,cl_event *event_wait_list,cl_event *event)

{
  ulong uVar1;
  cl_api_clGetDeviceInfo enqueueCounter_00;
  bool bVar2;
  bool bVar3;
  cl_int cVar4;
  CLIntercept *this;
  cl_icd_dispatch *pcVar5;
  SConfig *pSVar6;
  CLIntercept *pCVar7;
  SConfig *pSVar8;
  undefined8 uVar9;
  cl_kernel in_RCX;
  cl_uint in_EDX;
  cl_kernel in_RSI;
  CLIntercept *in_RDI;
  cl_event *in_R8;
  size_t *unaff_retaddr;
  cl_command_queue in_stack_00000008;
  CLIntercept *in_stack_00000168;
  time_point toolEnd_1;
  time_point toolStart_1;
  cl_int e;
  time_point toolEnd;
  time_point toolStart;
  time_point cpuEnd;
  time_point cpuStart;
  bool isLocalEvent;
  cl_event local_event;
  time_point queuedTime;
  string deviceTag;
  string hostTag;
  string eventWaitListString;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLIntercept *pIntercept;
  size_t *in_stack_00000460;
  size_t *in_stack_00000468;
  cl_uint in_stack_00000474;
  cl_kernel in_stack_00000478;
  CLIntercept *in_stack_00000480;
  size_t *in_stack_00000568;
  size_t *in_stack_00000570;
  cl_uint in_stack_0000057c;
  cl_kernel in_stack_00000580;
  cl_command_queue in_stack_00000588;
  CLIntercept *in_stack_00000590;
  size_t *in_stack_000005a0;
  string *in_stack_000005a8;
  string *in_stack_000005b0;
  CLIntercept *in_stack_fffffffffffffbe0;
  _cl_event *in_stack_fffffffffffffbf0;
  CObjectTracker *in_stack_fffffffffffffbf8;
  allocator *paVar10;
  uint64_t in_stack_fffffffffffffc00;
  CLIntercept *in_stack_fffffffffffffc08;
  CLIntercept *in_stack_fffffffffffffc10;
  CLIntercept *in_stack_fffffffffffffc38;
  CLIntercept *in_stack_fffffffffffffc40;
  CLIntercept *in_stack_fffffffffffffc48;
  cl_event *in_stack_fffffffffffffc50;
  cl_event p_Var11;
  cl_event *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  cl_uint numEvents;
  cl_event in_stack_fffffffffffffc68;
  CLIntercept *in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined1 includeId;
  SConfig *in_stack_fffffffffffffc80;
  SConfig *in_stack_fffffffffffffc88;
  CLIntercept *in_stack_fffffffffffffc90;
  time_point in_stack_fffffffffffffc98;
  time_point in_stack_fffffffffffffca0;
  time_point in_stack_fffffffffffffca8;
  time_point in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  SConfig *in_stack_fffffffffffffce8;
  CLIntercept *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffd00;
  SConfig *in_stack_fffffffffffffd10;
  time_point in_stack_fffffffffffffd20;
  SConfig *in_stack_fffffffffffffd30;
  int local_24c;
  undefined8 local_248;
  undefined8 local_240;
  allocator local_231;
  string local_230 [36];
  char *in_stack_fffffffffffffdf8;
  CLIntercept *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  CLIntercept *in_stack_fffffffffffffe10;
  undefined8 local_1c0;
  allocator local_1a1;
  string local_1a0 [32];
  undefined8 local_180;
  undefined8 local_178;
  allocator local_169;
  string local_168 [24];
  undefined8 local_128;
  cl_event local_c8;
  undefined8 local_c0;
  string local_b8 [32];
  cl_api_clGetDeviceInfo local_48;
  cl_int local_3c;
  undefined4 in_stack_ffffffffffffffe0;
  cl_kernel p_Var12;
  CLIntercept *pCVar13;
  cl_int local_4;
  
  includeId = (undefined1)((ulong)in_stack_fffffffffffffc78 >> 0x38);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pcVar5 = CLIntercept::dispatch(this), pcVar5->clEnqueueTask == (cl_api_clEnqueueTask)0x0)) {
    local_24c = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_24c);
    local_4 = -0x24;
  }
  else {
    local_3c = 0;
    local_48 = (cl_api_clGetDeviceInfo)
               CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffc48);
    pSVar6 = CLIntercept::config(this);
    if ((((pSVar6->AubCapture & 1U) != 0) &&
        (bVar2 = CLIntercept::checkAubCaptureEnqueueLimits(this,(uint64_t)local_48), bVar2)) &&
       (bVar2 = CLIntercept::checkAubCaptureKernelSignature
                          (in_stack_00000480,in_stack_00000478,in_stack_00000474,in_stack_00000468,
                           in_stack_00000460), bVar2)) {
      pCVar7 = in_RDI;
      CLIntercept::startAubCapture
                (in_RDI,(char *)in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,
                 (cl_uint)((ulong)in_R8 >> 0x20),&this->m_ProcessId,unaff_retaddr,in_stack_00000008)
      ;
      in_stack_fffffffffffffbe0 = in_RDI;
      in_RDI = pCVar7;
    }
    pSVar6 = CLIntercept::config(this);
    if ((pSVar6->NullEnqueue & 1U) == 0) {
      getFormattedEventWaitList_abi_cxx11_
                (in_stack_fffffffffffffc08,(cl_uint)(in_stack_fffffffffffffc00 >> 0x20),
                 (cl_event *)in_stack_fffffffffffffbf8);
      pSVar6 = CLIntercept::config(this);
      enqueueCounter_00 = local_48;
      p_Var12 = in_RSI;
      if ((pSVar6->CallLogging & 1U) != 0) {
        pCVar7 = this;
        pCVar13 = in_RDI;
        in_stack_fffffffffffffbe0 = (CLIntercept *)std::__cxx11::string::c_str();
        CLIntercept::callLoggingEnter
                  (this,"clEnqueueTask",(uint64_t)enqueueCounter_00,in_RSI,
                   "queue = %p, kernel = %p%s",in_RDI,in_RSI);
        this = pCVar7;
        in_RDI = pCVar13;
      }
      pSVar6 = CLIntercept::config(this);
      if ((pSVar6->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,numEvents,
                   in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      }
      std::__cxx11::string::string((string *)&stack0xffffffffffffff68);
      std::__cxx11::string::string(local_b8);
      pSVar6 = CLIntercept::config(this);
      if ((((pSVar6->ChromeCallLogging & 1U) != 0) ||
          ((pSVar6 = CLIntercept::config(this), (pSVar6->HostPerformanceTiming & 1U) != 0 &&
           (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)local_48),
           bVar2)))) ||
         (((pSVar6 = CLIntercept::config(this), (pSVar6->DevicePerformanceTiming & 1U) != 0 ||
           (((pSVar6 = CLIntercept::config(this), (pSVar6->ITTPerformanceTiming & 1U) != 0 ||
             (pSVar6 = CLIntercept::config(this), (pSVar6->ChromePerformanceTiming & 1U) != 0)) ||
            (pSVar6 = CLIntercept::config(this),
            (pSVar6->DevicePerfCounterEventBasedSampling & 1U) != 0)))) &&
          (bVar2 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(this,(uint64_t)local_48),
          bVar2)))) {
        in_stack_fffffffffffffbe0 = (CLIntercept *)&stack0xffffffffffffff68;
        CLIntercept::getTimingTagsKernel
                  (in_stack_00000590,in_stack_00000588,in_stack_00000580,in_stack_0000057c,
                   in_stack_00000570,in_stack_00000568,in_stack_000005a0,in_stack_000005a8,
                   in_stack_000005b0);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffbe0);
      local_c8 = (cl_event)0x0;
      bVar2 = false;
      pSVar6 = CLIntercept::config(this);
      if (((((pSVar6->DevicePerformanceTiming & 1U) != 0) ||
           (in_stack_fffffffffffffd30 = CLIntercept::config(this),
           (in_stack_fffffffffffffd30->ITTPerformanceTiming & 1U) != 0)) ||
          (pSVar6 = CLIntercept::config(this), (pSVar6->ChromePerformanceTiming & 1U) != 0)) ||
         (in_stack_fffffffffffffd20.__d.__r = (duration)CLIntercept::config(this),
         (((SConfig *)in_stack_fffffffffffffd20.__d.__r)->DevicePerfCounterEventBasedSampling & 1U)
         != 0)) {
        local_c0 = std::chrono::_V2::steady_clock::now();
        bVar2 = in_R8 == (cl_event *)0x0;
        if (bVar2) {
          in_R8 = &local_c8;
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffbe0);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffbe0);
      pCVar7 = (CLIntercept *)CLIntercept::config(this);
      if ((((ulong)(pCVar7->m_Dispatch).clCreateContextFromType & 1) != 0) ||
         (in_stack_fffffffffffffd10 = CLIntercept::config(this),
         (in_stack_fffffffffffffd10->ChromeCallLogging & 1U) != 0)) {
        std::chrono::_V2::steady_clock::now();
      }
      pcVar5 = CLIntercept::dispatch(this);
      cVar4 = (*pcVar5->clEnqueueTask)
                        ((cl_command_queue)in_RDI,p_Var12,in_EDX,(cl_event *)in_RCX,in_R8);
      local_3c = cVar4;
      pSVar6 = CLIntercept::config(this);
      if (((pSVar6->HostPerformanceTiming & 1U) != 0) ||
         (in_stack_fffffffffffffcf0 = (CLIntercept *)CLIntercept::config(this),
         ((in_stack_fffffffffffffcf0->m_Mutex).super___mutex_base._M_mutex.__size[0x11] & 1U) != 0))
      {
        std::chrono::_V2::steady_clock::now();
        in_stack_fffffffffffffce8 = CLIntercept::config(this);
        if (((in_stack_fffffffffffffce8->HostPerformanceTiming & 1U) != 0) &&
           (in_stack_fffffffffffffce7 =
                 CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)local_48),
           (bool)in_stack_fffffffffffffce7)) {
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffca0.__d.__r,
                     (char *)in_stack_fffffffffffffc98.__d.__r,(string *)in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        }
      }
      pSVar8 = CLIntercept::config(this);
      if ((((((pSVar8->DevicePerformanceTiming & 1U) != 0) ||
            (pSVar8 = CLIntercept::config(this), (pSVar8->ITTPerformanceTiming & 1U) != 0)) ||
           (pSVar8 = CLIntercept::config(this), (pSVar8->ChromePerformanceTiming & 1U) != 0)) ||
          (pSVar8 = CLIntercept::config(this),
          (pSVar8->DevicePerfCounterEventBasedSampling & 1U) != 0)) && (in_R8 != (cl_event *)0x0)) {
        bVar3 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(this,(uint64_t)local_48);
        if (bVar3) {
          CLIntercept::addTimingEvent
                    (pCVar7,&in_stack_fffffffffffffd10->SuppressLogging,(uint64_t)pcVar5,
                     in_stack_fffffffffffffd20,(string *)CONCAT44(cVar4,in_stack_fffffffffffffd00),
                     (cl_command_queue)pSVar6,(cl_event)in_stack_fffffffffffffd30);
        }
        if (bVar2) {
          in_stack_fffffffffffffcb0.__d.__r = (duration)CLIntercept::dispatch(this);
          (*((cl_icd_dispatch *)in_stack_fffffffffffffcb0.__d.__r)->clReleaseEvent)(*in_R8);
          in_R8 = (cl_event *)0x0;
        }
      }
      in_stack_fffffffffffffca8.__d.__r = (duration)CLIntercept::config(this);
      if (((((((SConfig *)in_stack_fffffffffffffca8.__d.__r)->ErrorLogging & 1U) != 0) ||
           (in_stack_fffffffffffffca0.__d.__r = (duration)CLIntercept::config(this),
           ((((CLIntercept *)in_stack_fffffffffffffca0.__d.__r)->m_Mutex).super___mutex_base.
            _M_mutex.__size[0x14] & 1U) != 0)) ||
          (in_stack_fffffffffffffc98.__d.__r = (duration)CLIntercept::config(this),
          (((SConfig *)in_stack_fffffffffffffc98.__d.__r)->NoErrors & 1U) != 0)) && (local_3c != 0))
      {
        in_stack_fffffffffffffc90 = (CLIntercept *)CLIntercept::config(this);
        uVar9 = stack0xfffffffffffffdf0;
        if (((in_stack_fffffffffffffc90->m_Mutex).super___mutex_base._M_mutex.__size[0x13] & 1U) !=
            0) {
          uVar1 = (ulong)stack0xfffffffffffffdf0 >> 0x20;
          CLIntercept::logError(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(cl_int)uVar1);
          stack0xfffffffffffffdf0 = uVar9;
        }
        in_stack_fffffffffffffc88 = CLIntercept::config(this);
        if ((in_stack_fffffffffffffc88->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        in_stack_fffffffffffffc80 = CLIntercept::config(this);
        if ((in_stack_fffffffffffffc80->NoErrors & 1U) != 0) {
          local_3c = 0;
        }
      }
      pSVar6 = CLIntercept::config(this);
      if ((pSVar6->LeakChecking & 1U) != 0) {
        in_stack_fffffffffffffc70 = (CLIntercept *)CLIntercept::objectTracker(this);
        if (in_R8 == (cl_event *)0x0) {
          in_stack_fffffffffffffc68 = (cl_event)0x0;
        }
        else {
          in_stack_fffffffffffffc68 = *in_R8;
        }
        CObjectTracker::AddAllocation<_cl_event*>
                  (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      }
      includeId = (undefined1)((ulong)pSVar6 >> 0x38);
      pSVar6 = CLIntercept::config(this);
      if ((pSVar6->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                   (cl_int)((ulong)pSVar6 >> 0x20),in_stack_fffffffffffffc58,
                   (cl_sync_point_khr *)in_stack_fffffffffffffc50);
      }
      pSVar6 = CLIntercept::config(this);
      if ((pSVar6->ChromeCallLogging & 1U) != 0) {
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffc90,&in_stack_fffffffffffffc88->SuppressLogging,
                   (string *)in_stack_fffffffffffffc80,(bool)includeId,
                   (uint64_t)in_stack_fffffffffffffc70,in_stack_fffffffffffffca0,
                   in_stack_fffffffffffffc98);
      }
      if (in_R8 == (cl_event *)0x0) {
        p_Var11 = (cl_event)0x0;
      }
      else {
        p_Var11 = *in_R8;
      }
      if ((p_Var11 != (cl_event)0x0) &&
         ((pSVar6 = CLIntercept::config(this), (pSVar6->ChromeCallLogging & 1U) != 0 ||
          (in_stack_fffffffffffffc40 = (CLIntercept *)CLIntercept::config(this),
          ((ulong)(in_stack_fffffffffffffc40->m_Dispatch).clRetainSampler & 0x1000000000000) != 0)))
         ) {
        in_stack_fffffffffffffc38 = this;
        this = in_stack_fffffffffffffc38;
        CLIntercept::addEvent
                  (in_stack_fffffffffffffc10,(cl_event)in_stack_fffffffffffffc08,
                   in_stack_fffffffffffffc00);
      }
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    }
    cVar4 = (cl_int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    pSVar6 = CLIntercept::config(this);
    if ((pSVar6->FinishAfterEnqueue & 1U) == 0) {
      pSVar6 = CLIntercept::config(this);
      if ((pSVar6->FlushAfterEnqueue & 1U) != 0) {
        pcVar5 = CLIntercept::dispatch(this);
        (*pcVar5->clFlush)((cl_command_queue)in_RDI);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffbe0);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffbe0);
      pSVar6 = CLIntercept::config(this);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config(this), (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config(this), (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        local_128 = std::chrono::_V2::steady_clock::now();
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                (in_stack_fffffffffffffcf0,&in_stack_fffffffffffffce8->SuppressLogging,
                 (char *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      pcVar5 = CLIntercept::dispatch(this);
      (*pcVar5->clFinish)((cl_command_queue)in_RDI);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 (char *)in_stack_fffffffffffffe00,cVar4);
      pSVar6 = CLIntercept::config(this);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config(this), (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config(this), (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        uVar9 = std::chrono::_V2::steady_clock::now();
        pSVar6 = CLIntercept::config(this);
        if (((pSVar6->HostPerformanceTiming & 1U) != 0) &&
           (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)local_48),
           bVar2)) {
          std::allocator<char>::allocator();
          local_180 = uVar9;
          std::__cxx11::string::string(local_168,"",&local_169);
          local_178 = local_128;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffca0.__d.__r,
                     (char *)in_stack_fffffffffffffc98.__d.__r,(string *)in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
          std::__cxx11::string::~string(local_168);
          std::allocator<char>::~allocator((allocator<char> *)&local_169);
        }
        pSVar6 = CLIntercept::config(this);
        if ((pSVar6->ChromeCallLogging & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a0,"",&local_1a1);
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffc90,&in_stack_fffffffffffffc88->SuppressLogging,
                     (string *)in_stack_fffffffffffffc80,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffc70,in_stack_fffffffffffffca0,
                     in_stack_fffffffffffffc98);
          std::__cxx11::string::~string(local_1a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffbe0);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffbe0);
      pSVar6 = CLIntercept::config(this);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config(this), (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config(this), (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        local_1c0 = std::chrono::_V2::steady_clock::now();
      }
      CLIntercept::checkTimingEvents(in_stack_00000168);
      pSVar6 = CLIntercept::config(this);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config(this), (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config(this), (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        uVar9 = std::chrono::_V2::steady_clock::now();
        pSVar6 = CLIntercept::config(this);
        if (((pSVar6->HostPerformanceTiming & 1U) != 0) &&
           (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)local_48),
           bVar2)) {
          paVar10 = (allocator *)&stack0xfffffffffffffe07;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xfffffffffffffe08,"",paVar10);
          unique0x10001357 = uVar9;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffca0.__d.__r,
                     (char *)in_stack_fffffffffffffc98.__d.__r,(string *)in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe07);
        }
        pSVar6 = CLIntercept::config(this);
        if ((pSVar6->ChromeCallLogging & 1U) != 0) {
          paVar10 = &local_231;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_230,"",paVar10);
          local_240 = local_1c0;
          local_248 = uVar9;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffc90,&in_stack_fffffffffffffc88->SuppressLogging,
                     (string *)in_stack_fffffffffffffc80,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffc70,in_stack_fffffffffffffca0,
                     in_stack_fffffffffffffc98);
          std::__cxx11::string::~string(local_230);
          std::allocator<char>::~allocator((allocator<char> *)&local_231);
        }
      }
    }
    pSVar6 = CLIntercept::config(this);
    if (((pSVar6->AubCapture & 1U) != 0) &&
       ((pSVar6 = CLIntercept::config(this), (pSVar6->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar2 = CLIntercept::checkAubCaptureEnqueueLimits(this,(uint64_t)local_48), !bVar2)))) {
      CLIntercept::stopAubCapture
                (in_stack_fffffffffffffc40,(cl_command_queue)in_stack_fffffffffffffc38);
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueTask)(
    cl_command_queue command_queue,
    cl_kernel kernel,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueTask )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START_KERNEL( kernel, 0, NULL, NULL, command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            const std::string eventWaitListString = getFormattedEventWaitList(
                pIntercept,
                num_events_in_wait_list,
                event_wait_list);

            CALL_LOGGING_ENTER_KERNEL(
                kernel,
                "queue = %p, kernel = %p%s",
                command_queue,
                kernel,
                eventWaitListString.c_str());
            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            GET_TIMING_TAGS_KERNEL( command_queue, kernel, 0, NULL, NULL, NULL );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

            retVal = pIntercept->dispatch().clEnqueueTask(
                command_queue,
                kernel,
                num_events_in_wait_list,
                event_wait_list,
                event );

            HOST_PERFORMANCE_TIMING_END_WITH_TAG();
            DEVICE_PERFORMANCE_TIMING_END_WITH_TAG( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT_WITH_TAG( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}